

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  RayK<4> *pRVar2;
  RayK<4> *pRVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vfloat<4> vVar7;
  BVH *bvh;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar24;
  undefined4 uVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  NodeRef root;
  size_t sVar31;
  size_t sVar32;
  uint uVar33;
  ulong uVar34;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar35;
  NodeRef *pNVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar41;
  undefined1 in_ZMM0 [64];
  vint4 ai_2;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  vint4 ai;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 bi_3;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vint4 bi_2;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  vint4 bi_1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  vint4 ai_1;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  uint uVar88;
  uint uVar89;
  vint4 ai_3;
  undefined1 auVar85 [16];
  uint uVar90;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar98;
  float fVar99;
  vint4 bi;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_3738 [8];
  float fStack_3730;
  float fStack_372c;
  undefined1 local_3728 [8];
  float fStack_3720;
  float fStack_371c;
  undefined1 local_3718 [8];
  float fStack_3710;
  float fStack_370c;
  float local_36c8;
  float fStack_36c4;
  float fStack_36c0;
  float fStack_36bc;
  float local_36b8;
  float fStack_36b4;
  float fStack_36b0;
  float fStack_36ac;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar42 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar59 = vpcmpeqd_avx(auVar42,(undefined1  [16])valid_i->field_0);
    auVar51 = ZEXT816(0) << 0x40;
    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar51,5);
    auVar65 = auVar59 & auVar8;
    if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar65[0xf] < '\0')
    {
      auVar8 = vandps_avx(auVar8,auVar59);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar103._8_4_ = 0x7fffffff;
      auVar103._0_8_ = 0x7fffffff7fffffff;
      auVar103._12_4_ = 0x7fffffff;
      auVar59 = vandps_avx(auVar103,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar95._8_4_ = 0x219392ef;
      auVar95._0_8_ = 0x219392ef219392ef;
      auVar95._12_4_ = 0x219392ef;
      auVar59 = vcmpps_avx(auVar59,auVar95,1);
      auVar65 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar95,auVar59);
      auVar59 = vandps_avx(auVar103,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar59 = vcmpps_avx(auVar59,auVar95,1);
      auVar66 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar95,auVar59);
      auVar59 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar103);
      auVar59 = vcmpps_avx(auVar59,auVar95,1);
      auVar59 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar95,auVar59);
      auVar70 = vrcpps_avx(auVar65);
      auVar96._8_4_ = 0x3f800000;
      auVar96._0_8_ = 0x3f8000003f800000;
      auVar96._12_4_ = 0x3f800000;
      auVar65 = vfnmadd213ps_fma(auVar65,auVar70,auVar96);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar65,auVar70,auVar70)
      ;
      auVar65 = vrcpps_avx(auVar66);
      auVar66 = vfnmadd213ps_fma(auVar66,auVar65,auVar96);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar66,auVar65,auVar65)
      ;
      auVar65 = vrcpps_avx(auVar59);
      auVar59 = vfnmadd213ps_fma(auVar59,auVar65,auVar96);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar59,auVar65,auVar65)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * (float)tray.org.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * (float)tray.org.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * (float)tray.org.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * (float)tray.org.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar59 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar51,1);
      auVar65._8_4_ = 0x20;
      auVar65._0_8_ = 0x2000000020;
      auVar65._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar59,auVar65);
      auVar59 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar51,5);
      auVar66._8_4_ = 0x40;
      auVar66._0_8_ = 0x4000000040;
      auVar66._12_4_ = 0x40;
      auVar70._8_4_ = 0x60;
      auVar70._0_8_ = 0x6000000060;
      auVar70._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar70,auVar66,auVar59);
      auVar59 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar51,5);
      auVar71._8_4_ = 0x80;
      auVar71._0_8_ = 0x8000000080;
      auVar71._12_4_ = 0x80;
      auVar77._8_4_ = 0xa0;
      auVar77._0_8_ = 0xa0000000a0;
      auVar77._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar77,auVar71,auVar59);
      auVar59 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar51);
      auVar65 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar51);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar105 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar59,auVar8);
      auVar59._8_4_ = 0xff800000;
      auVar59._0_8_ = 0xff800000ff800000;
      auVar59._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar59,auVar65,auVar8);
      terminated.field_0.i[1] = auVar8._4_4_ ^ auVar42._4_4_;
      terminated.field_0.i[0] = auVar8._0_4_ ^ auVar42._0_4_;
      terminated.field_0.i[2] = auVar8._8_4_ ^ auVar42._8_4_;
      terminated.field_0.i[3] = auVar8._12_4_ ^ auVar42._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar33 = 3;
      }
      else {
        uVar33 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar36 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar35 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar42 = vpcmpeqd_avx(auVar8,auVar8);
      auVar102 = ZEXT1664(auVar42);
LAB_005a9679:
      do {
        do {
          root.ptr = pNVar36[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_005a9fd7;
          pNVar36 = pNVar36 + -1;
          paVar35 = paVar35 + -1;
          vVar7.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar35->v;
          auVar50 = ZEXT1664((undefined1  [16])vVar7.field_0);
          auVar42 = vcmpps_avx((undefined1  [16])vVar7.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar24 = vmovmskps_avx(auVar42);
        } while (uVar24 == 0);
        uVar28 = (ulong)(uVar24 & 0xff);
        uVar24 = POPCOUNT(uVar24 & 0xff);
        if (uVar33 < uVar24) {
LAB_005a96b7:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_005a9fd7;
              auVar42 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar50._0_16_,6);
              if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar42[0xf]) goto LAB_005a9679;
              uVar28 = (ulong)((uint)root.ptr & 0xf);
              aVar41 = terminated.field_0;
              if (uVar28 == 8) goto LAB_005a9eab;
              auVar51._0_4_ = auVar102._0_4_ ^ terminated.field_0._0_4_;
              auVar51._4_4_ = auVar102._4_4_ ^ terminated.field_0._4_4_;
              auVar51._8_4_ = auVar102._8_4_ ^ terminated.field_0._8_4_;
              auVar51._12_4_ = auVar102._12_4_ ^ terminated.field_0._12_4_;
              pRVar1 = ray + 0x50;
              pRVar2 = ray + 0x60;
              pRVar3 = ray + 0x40;
              lVar29 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar27 = 0;
              goto LAB_005a992a;
            }
            lVar29 = 0;
            sVar32 = 8;
            auVar42 = auVar105._0_16_;
            do {
              sVar31 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar29 * 8);
              if (sVar31 == 8) {
                auVar50 = ZEXT1664(auVar42);
                sVar31 = sVar32;
                break;
              }
              uVar25 = *(undefined4 *)(root.ptr + 0x40 + lVar29 * 4);
              auVar52._4_4_ = uVar25;
              auVar52._0_4_ = uVar25;
              auVar52._8_4_ = uVar25;
              auVar52._12_4_ = uVar25;
              auVar21._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar21._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar21._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar21._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar51 = vfmsub213ps_fma(auVar52,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar21);
              uVar25 = *(undefined4 *)(root.ptr + 0x80 + lVar29 * 4);
              auVar78._4_4_ = uVar25;
              auVar78._0_4_ = uVar25;
              auVar78._8_4_ = uVar25;
              auVar78._12_4_ = uVar25;
              auVar22._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar22._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar22._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar22._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar66 = vfmsub213ps_fma(auVar78,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar22);
              uVar25 = *(undefined4 *)(root.ptr + 0xc0 + lVar29 * 4);
              auVar85._4_4_ = uVar25;
              auVar85._0_4_ = uVar25;
              auVar85._8_4_ = uVar25;
              auVar85._12_4_ = uVar25;
              auVar23._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar23._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar23._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar23._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar70 = vfmsub213ps_fma(auVar85,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar23);
              uVar25 = *(undefined4 *)(root.ptr + 0x60 + lVar29 * 4);
              auVar97._4_4_ = uVar25;
              auVar97._0_4_ = uVar25;
              auVar97._8_4_ = uVar25;
              auVar97._12_4_ = uVar25;
              auVar71 = vfmsub213ps_fma(auVar97,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar21);
              uVar25 = *(undefined4 *)(root.ptr + 0xa0 + lVar29 * 4);
              auVar72._4_4_ = uVar25;
              auVar72._0_4_ = uVar25;
              auVar72._8_4_ = uVar25;
              auVar72._12_4_ = uVar25;
              auVar77 = vfmsub213ps_fma(auVar72,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar22);
              uVar25 = *(undefined4 *)(root.ptr + 0xe0 + lVar29 * 4);
              auVar60._4_4_ = uVar25;
              auVar60._0_4_ = uVar25;
              auVar60._8_4_ = uVar25;
              auVar60._12_4_ = uVar25;
              auVar95 = vfmsub213ps_fma(auVar60,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar23);
              auVar59 = vpminsd_avx(auVar51,auVar71);
              auVar65 = vpminsd_avx(auVar66,auVar77);
              auVar59 = vpmaxsd_avx(auVar59,auVar65);
              auVar65 = vpminsd_avx(auVar70,auVar95);
              auVar65 = vpmaxsd_avx(auVar59,auVar65);
              auVar59 = vpmaxsd_avx(auVar51,auVar71);
              auVar51 = vpmaxsd_avx(auVar66,auVar77);
              auVar51 = vpminsd_avx(auVar59,auVar51);
              auVar59 = vpmaxsd_avx(auVar70,auVar95);
              auVar51 = vpminsd_avx(auVar51,auVar59);
              auVar59 = vpmaxsd_avx(auVar65,(undefined1  [16])tray.tnear.field_0);
              auVar51 = vpminsd_avx(auVar51,(undefined1  [16])tray.tfar.field_0);
              auVar59 = vcmpps_avx(auVar59,auVar51,2);
              if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar59[0xf]) {
                auVar50 = ZEXT1664(auVar42);
                sVar31 = sVar32;
              }
              else {
                auVar59 = vblendvps_avx(auVar105._0_16_,auVar65,auVar59);
                auVar50 = ZEXT1664(auVar59);
                if (sVar32 != 8) {
                  pNVar36->ptr = sVar32;
                  pNVar36 = pNVar36 + 1;
                  *(undefined1 (*) [16])paVar35->v = auVar42;
                  paVar35 = paVar35 + 1;
                }
              }
              lVar29 = lVar29 + 1;
              auVar42 = auVar50._0_16_;
              sVar32 = sVar31;
            } while (lVar29 != 8);
            if (sVar31 == 8) goto LAB_005a9837;
            auVar42 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar50._0_16_,6);
            uVar25 = vmovmskps_avx(auVar42);
            root.ptr = sVar31;
          } while ((byte)uVar33 < (byte)POPCOUNT(uVar25));
          pNVar36->ptr = sVar31;
          pNVar36 = pNVar36 + 1;
          *paVar35 = auVar50._0_16_;
          paVar35 = paVar35 + 1;
LAB_005a9837:
          iVar26 = 4;
        }
        else {
          do {
            sVar32 = 0;
            for (uVar27 = uVar28; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              sVar32 = sVar32 + 1;
            }
            bVar37 = occluded1(This,bvh,root,sVar32,&pre,ray,&tray,context);
            if (bVar37) {
              terminated.field_0.i[sVar32] = -1;
            }
            uVar28 = uVar28 - 1 & uVar28;
          } while (uVar28 != 0);
          auVar42 = vpcmpeqd_avx(auVar102._0_16_,auVar102._0_16_);
          auVar102 = ZEXT1664(auVar42);
          auVar42 = auVar42 & ~(undefined1  [16])terminated.field_0;
          iVar26 = 3;
          if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar42[0xf] < '\0') {
            auVar42._8_4_ = 0xff800000;
            auVar42._0_8_ = 0xff800000ff800000;
            auVar42._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar42,
                               (undefined1  [16])terminated.field_0);
            iVar26 = 2;
          }
          auVar105 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar50 = ZEXT1664((undefined1  [16])vVar7.field_0);
          if (uVar33 < uVar24) goto LAB_005a96b7;
        }
      } while (iVar26 != 3);
LAB_005a9fd7:
      auVar8 = vandps_avx(auVar8,(undefined1  [16])terminated.field_0);
      auVar49._8_4_ = 0xff800000;
      auVar49._0_8_ = 0xff800000ff800000;
      auVar49._12_4_ = 0xff800000;
      auVar8 = vmaskmovps_avx(auVar8,auVar49);
      *(undefined1 (*) [16])(ray + 0x80) = auVar8;
    }
  }
  return;
  while( true ) {
    uVar27 = uVar27 + 1;
    lVar29 = lVar29 + 0xe0;
    auVar51 = auVar59;
    if (uVar28 - 8 <= uVar27) break;
LAB_005a992a:
    uVar30 = 0;
    auVar42 = auVar51;
    while (uVar34 = (ulong)*(uint *)(lVar29 + uVar30 * 4), uVar34 != 0xffffffff) {
      fVar94 = *(float *)(lVar29 + -0xc0 + uVar30 * 4);
      auVar67._4_4_ = fVar94;
      auVar67._0_4_ = fVar94;
      auVar67._8_4_ = fVar94;
      auVar67._12_4_ = fVar94;
      fVar4 = *(float *)(lVar29 + -0xb0 + uVar30 * 4);
      auVar104._4_4_ = fVar4;
      auVar104._0_4_ = fVar4;
      auVar104._8_4_ = fVar4;
      auVar104._12_4_ = fVar4;
      fVar98 = *(float *)(lVar29 + -0xa0 + uVar30 * 4);
      auVar106._4_4_ = fVar98;
      auVar106._0_4_ = fVar98;
      auVar106._8_4_ = fVar98;
      auVar106._12_4_ = fVar98;
      local_3718._4_4_ = *(float *)(lVar29 + -0x90 + uVar30 * 4);
      local_3728._4_4_ = *(float *)(lVar29 + -0x80 + uVar30 * 4);
      local_3738._4_4_ = *(float *)(lVar29 + -0x70 + uVar30 * 4);
      fVar5 = *(float *)(lVar29 + -0x20 + uVar30 * 4);
      fVar6 = *(float *)(lVar29 + -0x10 + uVar30 * 4);
      local_3718._0_4_ = local_3718._4_4_;
      fStack_3710 = (float)local_3718._4_4_;
      fStack_370c = (float)local_3718._4_4_;
      fVar99 = fVar94 - (float)local_3718._4_4_;
      auVar91._4_4_ = fVar99;
      auVar91._0_4_ = fVar99;
      auVar91._8_4_ = fVar99;
      auVar91._12_4_ = fVar99;
      local_3728._0_4_ = local_3728._4_4_;
      fStack_3720 = (float)local_3728._4_4_;
      fStack_371c = (float)local_3728._4_4_;
      fVar100 = fVar4 - (float)local_3728._4_4_;
      local_3738._0_4_ = local_3738._4_4_;
      fStack_3730 = (float)local_3738._4_4_;
      fStack_372c = (float)local_3738._4_4_;
      fVar17 = fVar98 - (float)local_3738._4_4_;
      auVar53._4_4_ = fVar17;
      auVar53._0_4_ = fVar17;
      auVar53._8_4_ = fVar17;
      auVar53._12_4_ = fVar17;
      fVar4 = fVar5 - fVar4;
      auVar108._4_4_ = fVar4;
      auVar108._0_4_ = fVar4;
      auVar108._8_4_ = fVar4;
      auVar108._12_4_ = fVar4;
      fVar98 = fVar6 - fVar98;
      fVar99 = fVar99 * fVar4;
      auVar43._4_4_ = fVar98;
      auVar43._0_4_ = fVar98;
      auVar43._8_4_ = fVar98;
      auVar43._12_4_ = fVar98;
      fVar4 = fVar100 * fVar98;
      auVar73._4_4_ = fVar4;
      auVar73._0_4_ = fVar4;
      auVar73._8_4_ = fVar4;
      auVar73._12_4_ = fVar4;
      auVar95 = vfmsub231ps_fma(auVar73,auVar108,auVar53);
      fVar4 = *(float *)(lVar29 + -0x30 + uVar30 * 4);
      fVar94 = fVar4 - fVar94;
      fVar16 = fVar94 * fVar17;
      auVar61._4_4_ = fVar16;
      auVar61._0_4_ = fVar16;
      auVar61._8_4_ = fVar16;
      auVar61._12_4_ = fVar16;
      auVar96 = vfmsub231ps_fma(auVar61,auVar43,auVar91);
      auVar65 = vsubps_avx(auVar67,*(undefined1 (*) [16])ray);
      auVar66 = vsubps_avx(auVar104,*(undefined1 (*) [16])(ray + 0x10));
      auVar70 = vsubps_avx(auVar106,*(undefined1 (*) [16])(ray + 0x20));
      fVar16 = (float)*(undefined8 *)pRVar2;
      auVar111._0_4_ = auVar65._0_4_ * fVar16;
      fVar10 = (float)((ulong)*(undefined8 *)pRVar2 >> 0x20);
      auVar111._4_4_ = auVar65._4_4_ * fVar10;
      fVar12 = (float)*(undefined8 *)(ray + 0x68);
      auVar111._8_4_ = auVar65._8_4_ * fVar12;
      fVar14 = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      auVar111._12_4_ = auVar65._12_4_ * fVar14;
      auVar43 = vfmsub231ps_fma(auVar111,auVar70,*(undefined1 (*) [16])pRVar3);
      fVar9 = (float)*(undefined8 *)pRVar3;
      auVar82._0_4_ = auVar66._0_4_ * fVar9;
      fVar11 = (float)((ulong)*(undefined8 *)pRVar3 >> 0x20);
      auVar82._4_4_ = auVar66._4_4_ * fVar11;
      fVar13 = (float)*(undefined8 *)(ray + 0x48);
      auVar82._8_4_ = auVar66._8_4_ * fVar13;
      fVar15 = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      auVar82._12_4_ = auVar66._12_4_ * fVar15;
      auVar53 = vfmsub231ps_fma(auVar82,auVar65,*(undefined1 (*) [16])pRVar1);
      auVar44._0_4_ = fVar98 * auVar53._0_4_;
      auVar44._4_4_ = fVar98 * auVar53._4_4_;
      auVar44._8_4_ = fVar98 * auVar53._8_4_;
      auVar44._12_4_ = fVar98 * auVar53._12_4_;
      auVar59 = vfmadd231ps_fma(auVar44,auVar43,auVar108);
      auVar92._4_4_ = fVar100;
      auVar92._0_4_ = fVar100;
      auVar92._8_4_ = fVar100;
      auVar92._12_4_ = fVar100;
      auVar38._4_4_ = fVar94;
      auVar38._0_4_ = fVar94;
      auVar38._8_4_ = fVar94;
      auVar38._12_4_ = fVar94;
      auVar79._4_4_ = fVar99;
      auVar79._0_4_ = fVar99;
      auVar79._8_4_ = fVar99;
      auVar79._12_4_ = fVar99;
      auVar44 = vfmsub231ps_fma(auVar79,auVar38,auVar92);
      fVar94 = (float)*(undefined8 *)pRVar1;
      auVar93._0_4_ = fVar94 * auVar70._0_4_;
      fVar98 = (float)((ulong)*(undefined8 *)pRVar1 >> 0x20);
      auVar93._4_4_ = fVar98 * auVar70._4_4_;
      fVar99 = (float)*(undefined8 *)(ray + 0x58);
      auVar93._8_4_ = fVar99 * auVar70._8_4_;
      fVar100 = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      auVar93._12_4_ = fVar100 * auVar70._12_4_;
      auVar61 = vfmsub231ps_fma(auVar93,auVar66,*(undefined1 (*) [16])pRVar2);
      auVar71 = vfmadd231ps_fma(auVar59,auVar61,auVar38);
      auVar109._0_4_ = auVar44._0_4_ * fVar16;
      auVar109._4_4_ = auVar44._4_4_ * fVar10;
      auVar109._8_4_ = auVar44._8_4_ * fVar12;
      auVar109._12_4_ = auVar44._12_4_ * fVar14;
      auVar59 = vfmadd231ps_fma(auVar109,auVar96,*(undefined1 (*) [16])pRVar1);
      auVar77 = vfmadd231ps_fma(auVar59,auVar95,*(undefined1 (*) [16])pRVar3);
      auVar39._8_4_ = 0x80000000;
      auVar39._0_8_ = 0x8000000080000000;
      auVar39._12_4_ = 0x80000000;
      auVar59 = vandps_avx(auVar77,auVar39);
      uVar24 = auVar59._0_4_;
      auVar45._0_4_ = uVar24 ^ auVar71._0_4_;
      uVar88 = auVar59._4_4_;
      auVar45._4_4_ = uVar88 ^ auVar71._4_4_;
      uVar89 = auVar59._8_4_;
      auVar45._8_4_ = uVar89 ^ auVar71._8_4_;
      uVar90 = auVar59._12_4_;
      auVar45._12_4_ = uVar90 ^ auVar71._12_4_;
      auVar59 = vcmpps_avx(auVar45,_DAT_01f7aa10,5);
      auVar71 = auVar42 & auVar59;
      local_36b8 = (float)*(undefined8 *)(ray + 0x30);
      fStack_36b4 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      fStack_36b0 = (float)*(undefined8 *)(ray + 0x38);
      fStack_36ac = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_36c8 = (float)*(undefined8 *)(ray + 0x80);
      fStack_36c4 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
      fStack_36c0 = (float)*(undefined8 *)(ray + 0x88);
      fStack_36bc = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
      if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar71[0xf] < '\0'
         ) {
        auVar59 = vandps_avx(auVar59,auVar42);
        auVar55._0_4_ = auVar53._0_4_ * fVar17;
        auVar55._4_4_ = auVar53._4_4_ * fVar17;
        auVar55._8_4_ = auVar53._8_4_ * fVar17;
        auVar55._12_4_ = auVar53._12_4_ * fVar17;
        auVar71 = vfmadd213ps_fma(auVar92,auVar43,auVar55);
        auVar71 = vfmadd213ps_fma(auVar91,auVar61,auVar71);
        auVar75._0_4_ = uVar24 ^ auVar71._0_4_;
        auVar75._4_4_ = uVar88 ^ auVar71._4_4_;
        auVar75._8_4_ = uVar89 ^ auVar71._8_4_;
        auVar75._12_4_ = uVar90 ^ auVar71._12_4_;
        auVar71 = vcmpps_avx(auVar75,_DAT_01f7aa10,5);
        auVar43 = auVar59 & auVar71;
        if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar43[0xf] < '\0') {
          auVar43 = vandps_avx(auVar77,auVar103);
          auVar59 = vandps_avx(auVar59,auVar71);
          auVar71 = vsubps_avx(auVar43,auVar45);
          auVar71 = vcmpps_avx(auVar71,auVar75,5);
          auVar53 = auVar59 & auVar71;
          if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar53[0xf] < '\0') {
            auVar59 = vandps_avx(auVar71,auVar59);
            auVar76._0_4_ = auVar70._0_4_ * auVar44._0_4_;
            auVar76._4_4_ = auVar70._4_4_ * auVar44._4_4_;
            auVar76._8_4_ = auVar70._8_4_ * auVar44._8_4_;
            auVar76._12_4_ = auVar70._12_4_ * auVar44._12_4_;
            auVar66 = vfmadd213ps_fma(auVar66,auVar96,auVar76);
            auVar65 = vfmadd132ps_fma(auVar65,auVar66,auVar95);
            auVar63._0_4_ = uVar24 ^ auVar65._0_4_;
            auVar63._4_4_ = uVar88 ^ auVar65._4_4_;
            auVar63._8_4_ = uVar89 ^ auVar65._8_4_;
            auVar63._12_4_ = uVar90 ^ auVar65._12_4_;
            auVar68._0_4_ = auVar43._0_4_ * local_36b8;
            auVar68._4_4_ = auVar43._4_4_ * fStack_36b4;
            auVar68._8_4_ = auVar43._8_4_ * fStack_36b0;
            auVar68._12_4_ = auVar43._12_4_ * fStack_36ac;
            auVar66 = vcmpps_avx(auVar68,auVar63,1);
            auVar56._0_4_ = auVar43._0_4_ * local_36c8;
            auVar56._4_4_ = auVar43._4_4_ * fStack_36c4;
            auVar56._8_4_ = auVar43._8_4_ * fStack_36c0;
            auVar56._12_4_ = auVar43._12_4_ * fStack_36bc;
            auVar70 = vcmpps_avx(auVar63,auVar56,2);
            auVar66 = vandps_avx(auVar70,auVar66);
            auVar70 = auVar59 & auVar66;
            if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar70[0xf] < '\0') {
              auVar59 = vandps_avx(auVar66,auVar59);
              auVar66 = vcmpps_avx(auVar77,_DAT_01f7aa10,4);
              auVar70 = auVar59 & auVar66;
              if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar70[0xf] < '\0') {
                uVar24 = ((context->scene->geometries).items[uVar34].ptr)->mask;
                auVar64._4_4_ = uVar24;
                auVar64._0_4_ = uVar24;
                auVar64._8_4_ = uVar24;
                auVar64._12_4_ = uVar24;
                auVar59 = vandps_avx(auVar66,auVar59);
                auVar66 = vpand_avx(auVar64,*(undefined1 (*) [16])(ray + 0x90));
                auVar66 = vpcmpeqd_avx(auVar66,_DAT_01f7aa10);
                auVar70 = auVar59 & ~auVar66;
                if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar70[0xf] < '\0') {
                  auVar59 = vandnps_avx(auVar66,auVar59);
                  auVar42 = vandnps_avx(auVar59,auVar42);
                }
              }
            }
          }
        }
      }
      if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar42[0xf])
      {
        auVar105 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar59 = vpcmpeqd_avx(auVar65,auVar65);
        auVar102 = ZEXT1664(auVar59);
        break;
      }
      uVar25 = *(undefined4 *)(lVar29 + -0x60 + uVar30 * 4);
      auVar62._4_4_ = uVar25;
      auVar62._0_4_ = uVar25;
      auVar62._8_4_ = uVar25;
      auVar62._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(lVar29 + -0x50 + uVar30 * 4);
      auVar74._4_4_ = uVar25;
      auVar74._0_4_ = uVar25;
      auVar74._8_4_ = uVar25;
      auVar74._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(lVar29 + -0x40 + uVar30 * 4);
      auVar80._4_4_ = uVar25;
      auVar80._0_4_ = uVar25;
      auVar80._8_4_ = uVar25;
      auVar80._12_4_ = uVar25;
      auVar18._4_4_ = fVar4;
      auVar18._0_4_ = fVar4;
      auVar18._8_4_ = fVar4;
      auVar18._12_4_ = fVar4;
      auVar65 = vsubps_avx(auVar62,auVar18);
      auVar20._4_4_ = fVar5;
      auVar20._0_4_ = fVar5;
      auVar20._8_4_ = fVar5;
      auVar20._12_4_ = fVar5;
      auVar66 = vsubps_avx(auVar74,auVar20);
      auVar19._4_4_ = fVar6;
      auVar19._0_4_ = fVar6;
      auVar19._8_4_ = fVar6;
      auVar19._12_4_ = fVar6;
      auVar70 = vsubps_avx(auVar80,auVar19);
      auVar71 = vsubps_avx(_local_3718,auVar62);
      auVar59 = vsubps_avx(_local_3728,auVar74);
      auVar77 = vsubps_avx(_local_3738,auVar80);
      auVar46._0_4_ = auVar66._0_4_ * auVar77._0_4_;
      auVar46._4_4_ = auVar66._4_4_ * auVar77._4_4_;
      auVar46._8_4_ = auVar66._8_4_ * auVar77._8_4_;
      auVar46._12_4_ = auVar66._12_4_ * auVar77._12_4_;
      auVar44 = vfmsub231ps_fma(auVar46,auVar59,auVar70);
      auVar54._0_4_ = auVar71._0_4_ * auVar70._0_4_;
      auVar54._4_4_ = auVar71._4_4_ * auVar70._4_4_;
      auVar54._8_4_ = auVar71._8_4_ * auVar70._8_4_;
      auVar54._12_4_ = auVar71._12_4_ * auVar70._12_4_;
      auVar61 = vfmsub231ps_fma(auVar54,auVar77,auVar65);
      auVar101._0_4_ = auVar59._0_4_ * auVar65._0_4_;
      auVar101._4_4_ = auVar59._4_4_ * auVar65._4_4_;
      auVar101._8_4_ = auVar59._8_4_ * auVar65._8_4_;
      auVar101._12_4_ = auVar59._12_4_ * auVar65._12_4_;
      auVar38 = vfmsub231ps_fma(auVar101,auVar71,auVar66);
      auVar95 = vsubps_avx(auVar62,*(undefined1 (*) [16])ray);
      auVar96 = vsubps_avx(auVar74,*(undefined1 (*) [16])(ray + 0x10));
      auVar43 = vsubps_avx(auVar80,*(undefined1 (*) [16])(ray + 0x20));
      auVar81._0_4_ = auVar43._0_4_ * fVar94;
      auVar81._4_4_ = auVar43._4_4_ * fVar98;
      auVar81._8_4_ = auVar43._8_4_ * fVar99;
      auVar81._12_4_ = auVar43._12_4_ * fVar100;
      auVar45 = vfmsub231ps_fma(auVar81,auVar96,*(undefined1 (*) [16])pRVar2);
      auVar83._0_4_ = auVar95._0_4_ * fVar16;
      auVar83._4_4_ = auVar95._4_4_ * fVar10;
      auVar83._8_4_ = auVar95._8_4_ * fVar12;
      auVar83._12_4_ = auVar95._12_4_ * fVar14;
      auVar67 = vfmsub231ps_fma(auVar83,auVar43,*(undefined1 (*) [16])pRVar3);
      auVar86._0_4_ = auVar96._0_4_ * fVar9;
      auVar86._4_4_ = auVar96._4_4_ * fVar11;
      auVar86._8_4_ = auVar96._8_4_ * fVar13;
      auVar86._12_4_ = auVar96._12_4_ * fVar15;
      auVar73 = vfmsub231ps_fma(auVar86,auVar95,*(undefined1 (*) [16])pRVar1);
      auVar112._0_4_ = auVar77._0_4_ * auVar73._0_4_;
      auVar112._4_4_ = auVar77._4_4_ * auVar73._4_4_;
      auVar112._8_4_ = auVar77._8_4_ * auVar73._8_4_;
      auVar112._12_4_ = auVar77._12_4_ * auVar73._12_4_;
      auVar77 = vfmadd231ps_fma(auVar112,auVar67,auVar59);
      auVar107._0_4_ = auVar38._0_4_ * fVar16;
      auVar107._4_4_ = auVar38._4_4_ * fVar10;
      auVar107._8_4_ = auVar38._8_4_ * fVar12;
      auVar107._12_4_ = auVar38._12_4_ * fVar14;
      auVar59 = vfmadd231ps_fma(auVar107,auVar61,*(undefined1 (*) [16])pRVar1);
      auVar53 = vfmadd231ps_fma(auVar59,auVar44,*(undefined1 (*) [16])pRVar3);
      auVar59 = vandps_avx(auVar53,auVar39);
      auVar71 = vfmadd231ps_fma(auVar77,auVar45,auVar71);
      uVar24 = auVar59._0_4_;
      auVar110._0_4_ = auVar71._0_4_ ^ uVar24;
      uVar88 = auVar59._4_4_;
      auVar110._4_4_ = auVar71._4_4_ ^ uVar88;
      uVar89 = auVar59._8_4_;
      auVar110._8_4_ = auVar71._8_4_ ^ uVar89;
      uVar90 = auVar59._12_4_;
      auVar110._12_4_ = auVar71._12_4_ ^ uVar90;
      auVar59 = vcmpps_avx(auVar110,_DAT_01f7aa10,5);
      auVar71 = auVar42 & auVar59;
      if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar71[0xf] < '\0'
         ) {
        auVar59 = vandps_avx(auVar59,auVar42);
        auVar87._0_4_ = auVar73._0_4_ * auVar70._0_4_;
        auVar87._4_4_ = auVar73._4_4_ * auVar70._4_4_;
        auVar87._8_4_ = auVar73._8_4_ * auVar70._8_4_;
        auVar87._12_4_ = auVar73._12_4_ * auVar70._12_4_;
        auVar66 = vfmadd213ps_fma(auVar66,auVar67,auVar87);
        auVar65 = vfmadd213ps_fma(auVar65,auVar45,auVar66);
        auVar84._0_4_ = uVar24 ^ auVar65._0_4_;
        auVar84._4_4_ = uVar88 ^ auVar65._4_4_;
        auVar84._8_4_ = uVar89 ^ auVar65._8_4_;
        auVar84._12_4_ = uVar90 ^ auVar65._12_4_;
        auVar65 = vcmpps_avx(auVar84,_DAT_01f7aa10,5);
        auVar66 = auVar59 & auVar65;
        if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar66[0xf] < '\0') {
          auVar66 = vandps_avx(auVar53,auVar103);
          auVar59 = vandps_avx(auVar65,auVar59);
          auVar65 = vsubps_avx(auVar66,auVar110);
          auVar65 = vcmpps_avx(auVar65,auVar84,5);
          auVar70 = auVar59 & auVar65;
          if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar70[0xf] < '\0') {
            auVar59 = vandps_avx(auVar59,auVar65);
            auVar69._0_4_ = auVar38._0_4_ * auVar43._0_4_;
            auVar69._4_4_ = auVar38._4_4_ * auVar43._4_4_;
            auVar69._8_4_ = auVar38._8_4_ * auVar43._8_4_;
            auVar69._12_4_ = auVar38._12_4_ * auVar43._12_4_;
            auVar65 = vfmadd213ps_fma(auVar96,auVar61,auVar69);
            auVar65 = vfmadd213ps_fma(auVar95,auVar44,auVar65);
            auVar40._0_4_ = uVar24 ^ auVar65._0_4_;
            auVar40._4_4_ = uVar88 ^ auVar65._4_4_;
            auVar40._8_4_ = uVar89 ^ auVar65._8_4_;
            auVar40._12_4_ = uVar90 ^ auVar65._12_4_;
            auVar47._0_4_ = auVar66._0_4_ * local_36b8;
            auVar47._4_4_ = auVar66._4_4_ * fStack_36b4;
            auVar47._8_4_ = auVar66._8_4_ * fStack_36b0;
            auVar47._12_4_ = auVar66._12_4_ * fStack_36ac;
            auVar65 = vcmpps_avx(auVar47,auVar40,1);
            auVar57._0_4_ = auVar66._0_4_ * local_36c8;
            auVar57._4_4_ = auVar66._4_4_ * fStack_36c4;
            auVar57._8_4_ = auVar66._8_4_ * fStack_36c0;
            auVar57._12_4_ = auVar66._12_4_ * fStack_36bc;
            auVar66 = vcmpps_avx(auVar40,auVar57,2);
            auVar65 = vandps_avx(auVar66,auVar65);
            auVar66 = auVar59 & auVar65;
            if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar66[0xf] < '\0') {
              auVar59 = vandps_avx(auVar65,auVar59);
              auVar65 = vcmpps_avx(auVar53,_DAT_01f7aa10,4);
              auVar66 = auVar59 & auVar65;
              if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar66[0xf] < '\0') {
                uVar24 = ((context->scene->geometries).items[uVar34].ptr)->mask;
                auVar58._4_4_ = uVar24;
                auVar58._0_4_ = uVar24;
                auVar58._8_4_ = uVar24;
                auVar58._12_4_ = uVar24;
                auVar59 = vandps_avx(auVar65,auVar59);
                auVar65 = vpand_avx(auVar58,*(undefined1 (*) [16])(ray + 0x90));
                auVar65 = vpcmpeqd_avx(auVar65,_DAT_01f7aa10);
                auVar66 = auVar59 & ~auVar65;
                if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar66[0xf] < '\0') {
                  auVar59 = vandnps_avx(auVar65,auVar59);
                  auVar42 = vandnps_avx(auVar59,auVar42);
                }
              }
            }
          }
        }
      }
      auVar105 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar59 = vpcmpeqd_avx(auVar38,auVar38);
      auVar102 = ZEXT1664(auVar59);
      if (((((auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar42[0xf])
         || (bVar37 = 2 < uVar30, uVar30 = uVar30 + 1, bVar37)) break;
    }
    auVar59 = vandps_avx(auVar42,auVar51);
    auVar51 = auVar51 & auVar42;
    if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar51[0xf])
    break;
  }
  aVar41._0_4_ = auVar102._0_4_ ^ auVar59._0_4_;
  aVar41._4_4_ = auVar102._4_4_ ^ auVar59._4_4_;
  aVar41._8_4_ = auVar102._8_4_ ^ auVar59._8_4_;
  aVar41._12_4_ = auVar102._12_4_ ^ auVar59._12_4_;
LAB_005a9eab:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar41);
  auVar42 = auVar102._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar42[0xf])
  goto LAB_005a9fd7;
  auVar48._8_4_ = 0xff800000;
  auVar48._0_8_ = 0xff800000ff800000;
  auVar48._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar48,
                     (undefined1  [16])terminated.field_0);
  goto LAB_005a9679;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }